

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O0

Expression *
slang::ast::CopyClassExpression::fromSyntax
          (Compilation *compilation,CopyClassExpressionSyntax *syntax,ASTContext *context)

{
  Expression *pEVar1;
  CopyClassExpressionSyntax *this;
  bool bVar2;
  ExpressionSyntax *syntax_00;
  Type *pTVar3;
  Diagnostic *diag;
  SourceRange local_50;
  Compilation *local_40;
  CopyClassExpression *result;
  Expression *local_30;
  Expression *source;
  ASTContext *context_local;
  CopyClassExpressionSyntax *syntax_local;
  Compilation *compilation_local;
  
  source = (Expression *)context;
  context_local = (ASTContext *)syntax;
  syntax_local = (CopyClassExpressionSyntax *)compilation;
  syntax_00 = not_null<slang::syntax::ExpressionSyntax_*>::operator*(&syntax->expr);
  pEVar1 = source;
  bitmask<slang::ast::ASTFlags>::bitmask((bitmask<slang::ast::ASTFlags> *)&result,None);
  local_30 = Expression::selfDetermined
                       (compilation,syntax_00,(ASTContext *)pEVar1,
                        (bitmask<slang::ast::ASTFlags>)result);
  this = syntax_local;
  pTVar3 = not_null<const_slang::ast::Type_*>::operator*(&local_30->type);
  pEVar1 = local_30;
  local_50 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)context_local);
  local_40 = (Compilation *)
             BumpAllocator::
             emplace<slang::ast::CopyClassExpression,slang::ast::Type_const&,slang::ast::Expression&,slang::SourceRange>
                       ((BumpAllocator *)this,pTVar3,pEVar1,&local_50);
  bVar2 = Expression::bad(local_30);
  if (bVar2) {
    compilation_local =
         (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)local_40);
  }
  else {
    pTVar3 = not_null<const_slang::ast::Type_*>::operator->(&local_30->type);
    bVar2 = Type::isClass(pTVar3);
    if (bVar2) {
      compilation_local = local_40;
    }
    else {
      diag = ASTContext::addDiag((ASTContext *)source,(DiagCode)0x3c0007,local_30->sourceRange);
      pTVar3 = not_null<const_slang::ast::Type_*>::operator*(&local_30->type);
      ast::operator<<(diag,pTVar3);
      compilation_local =
           (Compilation *)Expression::badExpr((Compilation *)syntax_local,(Expression *)local_40);
    }
  }
  return (Expression *)compilation_local;
}

Assistant:

Expression& CopyClassExpression::fromSyntax(Compilation& compilation,
                                            const CopyClassExpressionSyntax& syntax,
                                            const ASTContext& context) {
    auto& source = selfDetermined(compilation, *syntax.expr, context);
    auto result = compilation.emplace<CopyClassExpression>(*source.type, source,
                                                           syntax.sourceRange());
    if (source.bad())
        return badExpr(compilation, result);

    if (!source.type->isClass()) {
        context.addDiag(diag::CopyClassTarget, source.sourceRange) << *source.type;
        return badExpr(compilation, result);
    }

    return *result;
}